

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vec3f * barycentric(vec3f *__return_storage_ptr__,vec2i *pts,vec2i P)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  vec<3UL,_double> *this;
  double extraout_XMM0_Qa;
  vec<3UL,_double> local_60;
  vec<3UL,_double> local_48;
  undefined1 local_30 [8];
  vec3f u;
  vec2i *pts_local;
  vec2i P_local;
  
  u.z = (double)pts;
  pts_local = (vec2i *)P;
  piVar6 = vec<2UL,_int>::operator[](pts + 2,0);
  iVar1 = *piVar6;
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)u.z,0);
  iVar2 = *piVar6;
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)((long)u.z + 8),0);
  iVar3 = *piVar6;
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)u.z,0);
  iVar4 = *piVar6;
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)u.z,0);
  iVar5 = *piVar6;
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)&pts_local,0);
  vec<3UL,_double>::vec
            (&local_48,(double)(iVar1 - iVar2),(double)(iVar3 - iVar4),(double)(iVar5 - *piVar6));
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)((long)u.z + 0x10),1);
  iVar1 = *piVar6;
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)u.z,1);
  iVar2 = *piVar6;
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)((long)u.z + 8),1);
  iVar3 = *piVar6;
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)u.z,1);
  iVar4 = *piVar6;
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)u.z,1);
  iVar5 = *piVar6;
  piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)&pts_local,1);
  vec<3UL,_double>::vec
            (&local_60,(double)(iVar1 - iVar2),(double)(iVar3 - iVar4),(double)(iVar5 - *piVar6));
  cross((vec3f *)local_30,&local_48,&local_60);
  this = (vec<3UL,_double> *)local_30;
  vec<3UL,_double>::operator[](this,2);
  std::abs((int)this);
  if (1.0 <= extraout_XMM0_Qa) {
    vec<3UL,_double>::vec
              (__return_storage_ptr__,1.0 - ((double)local_30 + u.x) / u.y,u.x / u.y,
               (double)local_30 / u.y);
  }
  else {
    vec<3UL,_double>::vec(__return_storage_ptr__,-1.0,1.0,1.0);
  }
  return __return_storage_ptr__;
}

Assistant:

vec3f barycentric(vec2i *pts, vec2i P)
{
    vec3f u = cross(vec3f(pts[2][0] - pts[0][0], pts[1][0] - pts[0][0], pts[0][0] - P[0]),
                    vec3f(pts[2][1] - pts[0][1], pts[1][1] - pts[0][1], pts[0][1] - P[1]));
    /* `pts` and `P` has integer value as coordinates
       so `abs(u[2])` < 1 means `u[2]` is 0, that means triangle is degenerate
       in this case return something with negative coordinates */
    if (std::abs(u[2]) < 1) return vec3f(-1, 1, 1);
    return vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
}